

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool operator_string_add(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_value_t value;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  uint32_t len_00;
  gravity_fiber_t *fiber;
  gravity_value_t gVar3;
  gravity_value_t v;
  char **local_2090;
  char *s;
  char buffer [4096];
  uint32_t len;
  gravity_string_t *s2;
  gravity_string_t *s1;
  char local_1058 [8];
  char _buffer [4096];
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_50;
  gravity_value_t v2;
  gravity_value_t v1;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  join_0x00000010_0x00000000_ = convert_value2string(vm,args[1]);
  aVar2.n = local_50.n;
  if (_buffer._4088_8_ == 0) {
    snprintf(local_1058,0x1000,"Unable to convert object to String");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1058);
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
    vm_local._7_1_ = false;
  }
  else {
    len_00 = *(int *)((long)&pgVar1->identifier + 4) + *(int *)((long)&(local_50.p)->identifier + 4)
    ;
    if (len_00 + 1 < 0x1000) {
      local_2090 = &s;
    }
    else {
      local_2090 = (char **)gravity_calloc(vm,1,(ulong)(len_00 + 1));
      if (local_2090 == (char **)0x0) {
        gVar3.field_1.n = 0;
        gVar3.isa = gravity_class_null;
        gravity_vm_setslot(vm,gVar3,rindex);
        return false;
      }
    }
    memcpy(local_2090,pgVar1->objclass,(ulong)*(uint *)((long)&pgVar1->identifier + 4));
    memcpy((void *)((long)local_2090 + (ulong)*(uint *)((long)&pgVar1->identifier + 4)),
           (aVar2.p)->objclass,(ulong)*(uint *)((long)&(aVar2.p)->identifier + 4));
    gVar3 = gravity_string_to_value(vm,(char *)local_2090,len_00);
    if ((local_2090 != (char **)0x0) && (local_2090 != &s)) {
      free(local_2090);
    }
    gravity_vm_setslot(vm,gVar3,rindex);
    vm_local._7_1_ = true;
  }
  return vm_local._7_1_;
}

Assistant:

static bool operator_string_add (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_STRING(v2, true);

    gravity_string_t *s1 = VALUE_AS_STRING(v1);
    gravity_string_t *s2 = VALUE_AS_STRING(v2);

    uint32_t len = s1->len + s2->len;
    char buffer[4096];
    char *s = NULL;

    // check if I can save an allocation
    if (len+1 < sizeof(buffer)) s = buffer;
    else {
        s = mem_alloc(vm, len+1);
        CHECK_MEM_ALLOC(s);
    }

    memcpy(s, s1->s, s1->len);
    memcpy(s+s1->len, s2->s, s2->len);

    gravity_value_t v = VALUE_FROM_STRING(vm, s, len);
    if (s != NULL && s != buffer) mem_free(s);

    RETURN_VALUE(v, rindex);
}